

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::AssertHelper::operator=(AssertHelper *this,Message *message)

{
  UnitTest *this_00;
  UnitTestImpl *this_01;
  undefined8 *in_RDI;
  string *in_stack_000000b8;
  string *in_stack_000000c0;
  int in_stack_000000cc;
  char *in_stack_000000d0;
  Type in_stack_000000dc;
  UnitTest *in_stack_000000e0;
  undefined8 in_stack_ffffffffffffff60;
  int skip_count;
  allocator *paVar1;
  bool local_5e;
  allocator local_5d [13];
  Message *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  string local_30 [48];
  
  skip_count = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  UnitTest::GetInstance();
  AppendUserMessage(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  local_5e = anon_unknown_35::ShouldEmitStackTraceForResultType(*(Type *)*in_RDI);
  if (local_5e) {
    this_00 = UnitTest::GetInstance();
    this_01 = UnitTest::impl(this_00);
    UnitTestImpl::CurrentOsStackTraceExceptTop_abi_cxx11_(this_01,skip_count);
  }
  else {
    paVar1 = local_5d;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,"",paVar1);
  }
  local_5e = !local_5e;
  UnitTest::AddTestPartResult
            (in_stack_000000e0,in_stack_000000dc,in_stack_000000d0,in_stack_000000cc,
             in_stack_000000c0,in_stack_000000b8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  if (local_5e) {
    std::allocator<char>::~allocator((allocator<char> *)local_5d);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void AssertHelper::operator=(const Message& message) const {
  UnitTest::GetInstance()->AddTestPartResult(
      data_->type, data_->file, data_->line,
      AppendUserMessage(data_->message, message),
      ShouldEmitStackTraceForResultType(data_->type)
          ? UnitTest::GetInstance()->impl()->CurrentOsStackTraceExceptTop(1)
          : ""
      // Skips the stack frame for this function itself.
  );  // NOLINT
}